

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pad-otp.c
# Opt level: O3

void pad_otp(uint32_t code,uint length,char *buf)

{
  char cVar1;
  bool bVar2;
  ulong uVar3;
  ulong uVar4;
  uint uVar5;
  byte *__s;
  char *pcVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  
  pcVar6 = buf + 1;
  uVar3 = (ulong)(length - 1);
  uVar5 = 0;
  iVar8 = 1;
  __s = (byte *)buf;
  do {
    *__s = (char)code + (char)(code / 10) * -10 | 0x30;
    __s = __s + 1;
    uVar5 = uVar5 + 1;
    pcVar6 = pcVar6 + 1;
    uVar7 = (int)uVar3 - 1;
    uVar3 = (ulong)uVar7;
    iVar8 = iVar8 + 1;
    bVar2 = 9 < code;
    code = code / 10;
  } while (bVar2);
  uVar9 = uVar5;
  if (uVar5 < length) {
    memset(__s,0x30,(ulong)(~uVar5 + length) + 1);
    __s = (byte *)(pcVar6 + uVar3);
    uVar9 = iVar8 + uVar7;
  }
  *__s = 0;
  if (1 < uVar9) {
    uVar7 = uVar5;
    if (uVar5 < length) {
      uVar7 = length;
    }
    uVar3 = (ulong)uVar5;
    if ((ulong)uVar5 < (ulong)length) {
      uVar3 = (ulong)length;
    }
    uVar4 = 0;
    do {
      uVar7 = uVar7 - 1;
      cVar1 = buf[uVar4];
      buf[uVar4] = buf[uVar7];
      buf[uVar7] = cVar1;
      uVar4 = uVar4 + 1;
    } while (uVar3 >> 1 != uVar4);
  }
  return;
}

Assistant:

void pad_otp(uint32_t code, unsigned length, char *buf) {
  unsigned i;
  unsigned len;
  char *pbuf = buf;

  do {
    int digit = code % 10;
    *(pbuf++) = '0' + digit;
    code /= 10;
  } while (code > 0);

  for (i = (pbuf - buf); i < length; i++) {
    *(pbuf++) = '0';
  }

  *pbuf = '\0';

  len = pbuf - buf;

  for (i = 0; i < len / 2; i++) {
    char tmp = buf[i];
    buf[i] = buf[len - i - 1];
    buf[len - i - 1] = tmp;
  }
}